

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

double __thiscall ON_Interval::ClampedParameterAt(ON_Interval *this,double x)

{
  double x_local;
  ON_Interval *this_local;
  
  if (((((x <= -1.23432101234321e+308) || (1.23432101234321e+308 <= x)) ||
       (this->m_t[0] <= -1.23432101234321e+308)) ||
      ((1.23432101234321e+308 < this->m_t[0] || this->m_t[0] == 1.23432101234321e+308 ||
       (this->m_t[1] <= -1.23432101234321e+308)))) ||
     (1.23432101234321e+308 < this->m_t[1] || this->m_t[1] == 1.23432101234321e+308)) {
    this_local = (ON_Interval *)ON_DBL_QNAN;
  }
  else if (0.0 < x) {
    if (x < 1.0) {
      if ((this->m_t[0] != this->m_t[1]) || (NAN(this->m_t[0]) || NAN(this->m_t[1]))) {
        this_local = (ON_Interval *)((1.0 - x) * this->m_t[0] + x * this->m_t[1]);
      }
      else {
        this_local = (ON_Interval *)this->m_t[0];
      }
    }
    else {
      this_local = (ON_Interval *)this->m_t[1];
    }
  }
  else {
    this_local = (ON_Interval *)this->m_t[0];
  }
  return (double)this_local;
}

Assistant:

double ON_Interval::ClampedParameterAt(
  double x
) const
{
  if (ON_IS_VALID(x) && ON_IS_VALID(m_t[0]) && ON_IS_VALID(m_t[1]))
  {

    if (x <= 0.0)
      return m_t[0];
    if (x >= 1.0)
      return m_t[1];
    if (m_t[0] == m_t[1])
      return m_t[0]; // no fuzz from a linear combination
    return ((1.0 - x) * m_t[0] + x * m_t[1]);
  }

  return ON_DBL_QNAN;
}